

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O0

bool __thiscall
crnlib::dxt1_endpoint_optimizer::try_median4
          (dxt1_endpoint_optimizer *this,vec3F *low_color,vec3F *high_color)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  int green;
  int red;
  vec<3U,_float> *rhs;
  unique_color *puVar4;
  long in_RDI;
  float fVar5;
  double dVar6;
  dxt1_solution_coordinates sc;
  vec3F v1;
  vec3F v0;
  uint j_3;
  uint i_2;
  bool improved;
  uint j_2;
  uint ri;
  uint j_1;
  bool empty_cell;
  float highest_weight;
  uint highest_index;
  float dist;
  uint j;
  int best_index;
  float best_dist;
  vec3F *v;
  uint i_1;
  float total_dist;
  float new_weights [4];
  vec3F new_means [4];
  uint iter;
  float prev_total_dist;
  uint reassign_rover;
  uint cMaxIters;
  fast_random rm;
  uint i;
  vec3F means [4];
  int in_stack_fffffffffffffe30;
  float in_stack_fffffffffffffe34;
  vec<3U,_float> *in_stack_fffffffffffffe38;
  dxt1_solution_coordinates *in_stack_fffffffffffffe40;
  vector<crnlib::unique_color> *in_stack_fffffffffffffe48;
  vec<3U,_float> *local_198;
  dxt1_solution_coordinates *pdVar7;
  dxt1_solution_coordinates *coords;
  dxt1_endpoint_optimizer *in_stack_fffffffffffffe98;
  vec<3U,_float> local_158;
  vec<3U,_float> local_14c;
  uint local_140;
  uint local_13c;
  bool local_135;
  vec<3U,_float> local_134;
  uint local_128;
  uint local_124;
  vec<3U,_float> local_120;
  uint local_114;
  byte local_10d;
  float local_10c;
  uint local_108;
  dxt1_solution_coordinates local_104 [3];
  float local_f8;
  uint local_f4;
  uint local_f0;
  float local_ec;
  vec<3U,_float> *local_e8;
  uint local_e0;
  float local_dc;
  float local_d8 [4];
  vec<3U,_float> local_c8 [4];
  vec<3U,_float> vStack_98;
  int local_8c;
  undefined4 local_88;
  fast_random local_84;
  vec<3U,_float> local_7c;
  vec<3U,_float> local_70;
  vec<3U,_float> local_64;
  vec<3U,_float> local_58;
  uint local_4c;
  vec<3U,_float> local_48 [2];
  float in_stack_ffffffffffffffd4;
  dxt1_endpoint_optimizer *in_stack_ffffffffffffffd8;
  dxt1_solution_coordinates local_18 [6];
  
  coords = (dxt1_solution_coordinates *)local_48;
  pdVar7 = local_18;
  do {
    vec<3U,_float>::vec((vec<3U,_float> *)coords);
    coords = coords + 3;
  } while (coords != pdVar7);
  uVar3 = vector<crnlib::unique_color>::size((vector<crnlib::unique_color> *)(in_RDI + 0x38));
  if (uVar3 < 5) {
    for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
      uVar3 = vector<crnlib::vec<3U,_float>_>::size
                        ((vector<crnlib::vec<3U,_float>_> *)(in_RDI + 0x870));
      uVar3 = math::minimum<int>(uVar3 - 1,local_4c);
      rhs = vector<crnlib::vec<3U,_float>_>::operator[]
                      ((vector<crnlib::vec<3U,_float>_> *)(in_RDI + 0x870),uVar3);
      vec<3U,_float>::operator=(local_48 + local_4c,rhs);
    }
  }
  else {
    crnlib::operator-((vec<3U,_float> *)in_stack_fffffffffffffe48,
                      (vec<3U,_float> *)in_stack_fffffffffffffe40);
    vec<3U,_float>::operator=(local_48,&local_58);
    crnlib::operator-((vec<3U,_float> *)in_stack_fffffffffffffe48,
                      (vec<3U,_float> *)in_stack_fffffffffffffe40);
    vec<3U,_float>::operator=((vec<3U,_float> *)&stack0xffffffffffffffdc,&local_64);
    vec<3U,_float>::lerp
              ((vec<3U,_float> *)in_stack_fffffffffffffe48,
               (vec<3U,_float> *)in_stack_fffffffffffffe40,
               (float)((ulong)in_stack_fffffffffffffe38 >> 0x20));
    vec<3U,_float>::operator=(local_48 + 1,&local_70);
    vec<3U,_float>::lerp
              ((vec<3U,_float> *)in_stack_fffffffffffffe48,
               (vec<3U,_float> *)in_stack_fffffffffffffe40,
               (float)((ulong)in_stack_fffffffffffffe38 >> 0x20));
    vec<3U,_float>::operator=((vec<3U,_float> *)&stack0xffffffffffffffd0,&local_7c);
    fast_random::fast_random(&local_84);
    local_88 = 8;
    local_8c = 0;
    vStack_98.m_s[2] = 1e+37;
    for (vStack_98.m_s[1] = 0.0; (uint)vStack_98.m_s[1] < 8;
        vStack_98.m_s[1] = (float)((int)vStack_98.m_s[1] + 1)) {
      local_198 = local_c8;
      do {
        vec<3U,_float>::vec(local_198);
        local_198 = local_198 + 1;
      } while (local_198 != &vStack_98);
      utils::zero_object<crnlib::vec<3u,float>[4]>((vec<3U,_float> (*) [4])0x1da2d8);
      utils::zero_object<float[4]>((float (*) [4])0x1da2e5);
      local_dc = 0.0;
      for (local_e0 = 0; uVar1 = local_e0,
          uVar3 = vector<crnlib::unique_color>::size
                            ((vector<crnlib::unique_color> *)(in_RDI + 0x38)), uVar1 < uVar3;
          local_e0 = local_e0 + 1) {
        local_e8 = vector<crnlib::vec<3U,_float>_>::operator[]
                             ((vector<crnlib::vec<3U,_float>_> *)(in_RDI + 0x870),local_e0);
        local_ec = vec<3U,_float>::squared_distance(local_48,local_e8);
        local_f0 = 0;
        for (local_f4 = 1; local_f4 < 4; local_f4 = local_f4 + 1) {
          local_f8 = vec<3U,_float>::squared_distance(local_48 + local_f4,local_e8);
          if (local_f8 < local_ec) {
            local_f0 = local_f4;
            local_ec = local_f8;
          }
        }
        local_dc = local_dc + local_ec;
        in_stack_fffffffffffffe48 = (vector<crnlib::unique_color> *)(in_RDI + 0x38);
        in_stack_fffffffffffffe38 = local_e8;
        vector<crnlib::unique_color>::operator[](in_stack_fffffffffffffe48,local_e0);
        in_stack_fffffffffffffe40 = local_104;
        crnlib::operator*(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34);
        vec<3U,_float>::operator+=
                  (local_c8 + (int)local_f0,(vec<3U,_float> *)in_stack_fffffffffffffe40);
        puVar4 = vector<crnlib::unique_color>::operator[](in_stack_fffffffffffffe48,local_e0);
        local_d8[(int)local_f0] = (float)puVar4->m_weight + local_d8[(int)local_f0];
      }
      local_108 = 0;
      local_10c = 0.0;
      local_10d = 0;
      for (local_114 = 0; local_114 < 4; local_114 = local_114 + 1) {
        if (local_d8[local_114] <= 0.0) {
          local_10d = 1;
        }
        else {
          operator/(in_stack_fffffffffffffe38,in_stack_fffffffffffffe34);
          vec<3U,_float>::operator=(local_48 + local_114,&local_120);
          if (local_10c < local_d8[local_114]) {
            local_10c = local_d8[local_114];
            local_108 = local_114;
          }
        }
      }
      if ((local_10d & 1) == 0) {
        dVar6 = std::fabs((double)(ulong)(uint)(local_dc - vStack_98.m_s[2]));
        if (SUB84(dVar6,0) < 1e-05) break;
        vStack_98.m_s[2] = local_dc;
      }
      else {
        vStack_98.m_s[2] = 1e+37;
      }
      if (((local_10d & 1) != 0) && (vStack_98.m_s[1] != 9.80909e-45)) {
        local_124 = local_108 + local_8c & 3;
        local_8c = local_8c + 1;
        for (local_128 = 0; local_128 < 4; local_128 = local_128 + 1) {
          if ((local_d8[local_128] == 0.0) && (!NAN(local_d8[local_128]))) {
            vec<3U,_float>::operator=(local_48 + local_128,local_48 + local_124);
            vec<3U,_float>::make_random
                      ((fast_random *)in_stack_fffffffffffffe48,
                       (float)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                       SUB84(in_stack_fffffffffffffe40,0));
            vec<3U,_float>::operator+=(local_48 + local_128,&local_134);
          }
        }
      }
    }
  }
  local_135 = false;
  for (local_13c = 0; uVar1 = local_13c, local_13c < 3; local_13c = local_13c + 1) {
    while (local_140 = uVar1 + 1, local_140 < 4) {
      operator+((vec<3U,_float> *)in_stack_fffffffffffffe48,
                (vec<3U,_float> *)in_stack_fffffffffffffe40);
      operator+((vec<3U,_float> *)in_stack_fffffffffffffe48,
                (vec<3U,_float> *)in_stack_fffffffffffffe40);
      fVar5 = vec<3U,_float>::operator[](&local_14c,0);
      dVar6 = std::floor((double)(ulong)(uint)(fVar5 * 31.0 + 0.5));
      green = (int)SUB84(dVar6,0);
      fVar5 = vec<3U,_float>::operator[](&local_14c,1);
      dVar6 = std::floor((double)(ulong)(uint)(fVar5 * 63.0 + 0.5));
      red = (int)SUB84(dVar6,0);
      fVar5 = vec<3U,_float>::operator[](&local_14c,2);
      std::floor((double)(ulong)(uint)(fVar5 * 31.0 + 0.5));
      color_quad<unsigned_char,_int>::color_quad
                ((color_quad<unsigned_char,_int> *)
                 CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),red,green,0,0x1da8b0)
      ;
      fVar5 = vec<3U,_float>::operator[](&local_158,0);
      dVar6 = std::floor((double)(ulong)(uint)(fVar5 * 31.0 + 0.5));
      in_stack_fffffffffffffe30 = (int)SUB84(dVar6,0);
      fVar5 = vec<3U,_float>::operator[](&local_158,1);
      dVar6 = std::floor((double)(ulong)(uint)(fVar5 * 63.0 + 0.5));
      in_stack_fffffffffffffe34 = (float)(int)SUB84(dVar6,0);
      fVar5 = vec<3U,_float>::operator[](&local_158,2);
      std::floor((double)(ulong)(uint)(fVar5 * 31.0 + 0.5));
      color_quad<unsigned_char,_int>::color_quad
                ((color_quad<unsigned_char,_int> *)
                 CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),red,green,0,0x1da96f)
      ;
      dxt1_solution_coordinates::dxt1_solution_coordinates
                (in_stack_fffffffffffffe40,(color_quad_u8 *)in_stack_fffffffffffffe38,
                 (color_quad_u8 *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 SUB41((uint)red >> 0x18,0));
      dxt1_solution_coordinates::canonicalize
                ((dxt1_solution_coordinates *)
                 CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      bVar2 = evaluate_solution(in_stack_fffffffffffffe98,coords,SUB81((ulong)pdVar7 >> 0x38,0));
      local_135 = (local_135 & 1U) != 0 || bVar2;
      uVar1 = local_140;
    }
  }
  bVar2 = refine_solution(in_stack_ffffffffffffffd8,(int)in_stack_ffffffffffffffd4);
  return (local_135 & 1U) != 0 || bVar2;
}

Assistant:

bool dxt1_endpoint_optimizer::try_median4(const vec3F& low_color, const vec3F& high_color) {
  vec3F means[4];

  if (m_unique_colors.size() <= 4) {
    for (uint i = 0; i < 4; i++)
      means[i] = m_norm_unique_colors[math::minimum<int>(m_norm_unique_colors.size() - 1, i)];
  } else {
    means[0] = low_color - m_mean_norm_color;
    means[3] = high_color - m_mean_norm_color;
    means[1] = vec3F::lerp(means[0], means[3], 1.0f / 3.0f);
    means[2] = vec3F::lerp(means[0], means[3], 2.0f / 3.0f);

    fast_random rm;

    const uint cMaxIters = 8;
    uint reassign_rover = 0;
    float prev_total_dist = math::cNearlyInfinite;
    for (uint iter = 0; iter < cMaxIters; iter++) {
      vec3F new_means[4];
      float new_weights[4];
      utils::zero_object(new_means);
      utils::zero_object(new_weights);

      float total_dist = 0;

      for (uint i = 0; i < m_unique_colors.size(); i++) {
        const vec3F& v = m_norm_unique_colors[i];

        float best_dist = means[0].squared_distance(v);
        int best_index = 0;

        for (uint j = 1; j < 4; j++) {
          float dist = means[j].squared_distance(v);
          if (dist < best_dist) {
            best_dist = dist;
            best_index = j;
          }
        }

        total_dist += best_dist;

        new_means[best_index] += v * (float)m_unique_colors[i].m_weight;
        new_weights[best_index] += (float)m_unique_colors[i].m_weight;
      }

      uint highest_index = 0;
      float highest_weight = 0;
      bool empty_cell = false;
      for (uint j = 0; j < 4; j++) {
        if (new_weights[j] > 0.0f) {
          means[j] = new_means[j] / new_weights[j];
          if (new_weights[j] > highest_weight) {
            highest_weight = new_weights[j];
            highest_index = j;
          }
        } else
          empty_cell = true;
      }

      if (!empty_cell) {
        if (fabs(total_dist - prev_total_dist) < .00001f)
          break;

        prev_total_dist = total_dist;
      } else
        prev_total_dist = math::cNearlyInfinite;

      if ((empty_cell) && (iter != (cMaxIters - 1))) {
        const uint ri = (highest_index + reassign_rover) & 3;
        reassign_rover++;

        for (uint j = 0; j < 4; j++) {
          if (new_weights[j] == 0.0f) {
            means[j] = means[ri];
            means[j] += vec3F::make_random(rm, -.00196f, .00196f);
          }
        }
      }
    }
  }

  bool improved = false;

  for (uint i = 0; i < 3; i++) {
    for (uint j = i + 1; j < 4; j++) {
      const vec3F v0(means[i] + m_mean_norm_color);
      const vec3F v1(means[j] + m_mean_norm_color);

      dxt1_solution_coordinates sc(
          color_quad_u8((int)floor(.5f + v0[0] * 31.0f), (int)floor(.5f + v0[1] * 63.0f), (int)floor(.5f + v0[2] * 31.0f), 255),
          color_quad_u8((int)floor(.5f + v1[0] * 31.0f), (int)floor(.5f + v1[1] * 63.0f), (int)floor(.5f + v1[2] * 31.0f), 255), false);

      sc.canonicalize();
      improved |= evaluate_solution(sc);
    }
  }

  improved |= refine_solution((m_pParams->m_quality == cCRNDXTQualityUber) ? 1 : 0);

  return improved;
}